

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

MXFReader * __thiscall
ASDCP::TimedText::MXFReader::ReadAncillaryResource
          (MXFReader *this,byte_t *uuid,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  h__Reader *phVar1;
  ulong uVar2;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  byte_t *uuid_local;
  MXFReader *this_local;
  
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)(uuid + 8));
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = mem_ptr<ASDCP::TimedText::MXFReader::h__Reader>::operator->
                       ((mem_ptr<ASDCP::TimedText::MXFReader::h__Reader> *)(uuid + 8));
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__ASDCPReader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = mem_ptr<ASDCP::TimedText::MXFReader::h__Reader>::operator->
                         ((mem_ptr<ASDCP::TimedText::MXFReader::h__Reader> *)(uuid + 8));
      h__Reader::ReadAncillaryResource((h__Reader *)this,(byte_t *)phVar1,FrameBuf,Ctx,HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::ReadAncillaryResource(const byte_t* uuid, FrameBuffer& FrameBuf,
						   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadAncillaryResource(uuid, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}